

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall Logger::writeLog(Logger *this,LogLevel level,string *date,string *message)

{
  ulong uVar1;
  ostream *poVar2;
  string *in_RCX;
  string *in_RDX;
  uint in_ESI;
  long in_RDI;
  
  needCreateNewLogFile(this);
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) != 0) {
    if ((int)in_ESI < 6) {
      poVar2 = std::operator<<((ostream *)(in_RDI + 0xa8),"[");
      poVar2 = std::operator<<(poVar2,in_RDX);
      poVar2 = std::operator<<(poVar2,"] [");
      poVar2 = std::operator<<(poVar2,(string *)(LogLevelNames_abi_cxx11_ + (ulong)in_ESI * 0x20));
      poVar2 = std::operator<<(poVar2,"] ");
      poVar2 = std::operator<<(poVar2,in_RCX);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)(in_RDI + 0xa8),"[");
      poVar2 = std::operator<<(poVar2,in_RDX);
      poVar2 = std::operator<<(poVar2,"] ");
      poVar2 = std::operator<<(poVar2,in_RCX);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::flush();
  }
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    if ((int)in_ESI < 6) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[");
      poVar2 = std::operator<<(poVar2,in_RDX);
      poVar2 = std::operator<<(poVar2,"] [");
      poVar2 = std::operator<<(poVar2,(string *)(LogLevelColors_abi_cxx11_ + (ulong)in_ESI * 0x20));
      poVar2 = std::operator<<(poVar2,(string *)(LogLevelNames_abi_cxx11_ + (ulong)in_ESI * 0x20));
      poVar2 = std::operator<<(poVar2,(string *)LogLevelReset_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"] ");
      poVar2 = std::operator<<(poVar2,in_RCX);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"[");
      poVar2 = std::operator<<(poVar2,in_RDX);
      poVar2 = std::operator<<(poVar2,"] ");
      poVar2 = std::operator<<(poVar2,in_RCX);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

inline void writeLog(LogLevel level, const std::string date, const std::string& message)  // 写入日志
    {
        needCreateNewLogFile();
#if defined(_WIN32) || defined(_WIN64)
        if (logFileHandle!= INVALID_HANDLE_VALUE) {      // 输出到文件
            if(level < LV_CLOSE) {
                std::string logMessage = "[" + date + "] [" + LogLevelNames[level] + "] " + message + "\r\n";
                DWORD bytesWritten = 0;
                WriteFile(logFileHandle, logMessage.c_str(), logMessage.length(), &bytesWritten, NULL);  
            }
        }
        if (outputToTerminal) {     // 输出到终端
            if(level < LV_CLOSE) std::cout << "[" << date << "] [" << LogLevelNames[level] << "] " << message << std::endl;
            else std::cout << "[" << date << "] " << message << std::endl;
        }
#else
        if (logfp.is_open()) {      // 输出到文件
            if(level < LV_CLOSE) logfp << "[" << date << "] [" << LogLevelNames[level] << "] " << message << std::endl;
            else logfp << "[" << date << "] " << message << std::endl;
            logfp.flush();
        }
        if (outputToTerminal) {     // 输出到终端
            if(level < LV_CLOSE) std::cout << "[" << date << "] [" << LogLevelColors[level] << LogLevelNames[level] << LogLevelReset << "] " << message << std::endl;
            else std::cout << "[" << date << "] " << message << std::endl;
        }
#endif 
    }